

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::~session_base_t(session_base_t *this)

{
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  int id_;
  void *pvVar1;
  own_t *in_stack_ffffffffffffffe0;
  
  id_ = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  *in_RDI = &PTR__session_base_t_002cb1b8;
  in_RDI[0xad] = &DAT_002cb2c8;
  in_RDI[0xaf] = &PTR__session_base_t_002cb300;
  if (in_RDI[0xb1] != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_pipe",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x92);
    fflush(_stderr);
    zmq_abort((char *)0x233e41);
  }
  if (in_RDI[0xb2] != 0) {
    in_stack_ffffffffffffffe0 = (own_t *)&stderr;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_zap_pipe",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x93);
    fflush((FILE *)(in_stack_ffffffffffffffe0->super_object_t)._vptr_object_t);
    zmq_abort((char *)0x233eb1);
  }
  if ((*(byte *)(in_RDI + 0xbd) & 1) != 0) {
    io_object_t::cancel_timer((io_object_t *)in_stack_ffffffffffffffe0,id_);
    *(undefined1 *)(in_RDI + 0xbd) = 0;
  }
  if (in_RDI[0xba] != 0) {
    (**(code **)(*(long *)in_RDI[0xba] + 0x20))();
  }
  pvVar1 = (void *)in_RDI[0xbe];
  if (pvVar1 != (void *)0x0) {
    address_t::~address_t((address_t *)this);
    operator_delete(pvVar1,0x50);
  }
  in_RDI[0xbe] = 0;
  std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::~set
            ((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *)
             0x233f5c);
  i_pipe_events::~i_pipe_events((i_pipe_events *)(in_RDI + 0xaf));
  io_object_t::~io_object_t((io_object_t *)0x233f7e);
  own_t::~own_t(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

zmq::session_base_t::~session_base_t ()
{
    zmq_assert (!_pipe);
    zmq_assert (!_zap_pipe);

    //  If there's still a pending linger timer, remove it.
    if (_has_linger_timer) {
        cancel_timer (linger_timer_id);
        _has_linger_timer = false;
    }

    //  Close the engine.
    if (_engine)
        _engine->terminate ();

    LIBZMQ_DELETE (_addr);
}